

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::LogDestination::SetLogDestination(LogSeverity severity,char *base_filename)

{
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *this;
  mutex *__mutex;
  string *psVar1;
  _Head_base<0UL,__IO_FILE_*,_false> __stream;
  char *pcVar2;
  int iVar3;
  LogDestination *pLVar4;
  pointer __p;
  _Head_base<0UL,_google::LogDestination_*,_false> local_30;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)log_mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  this = (__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
         (&log_destinations_ + severity);
  if ((this->_M_t).
      super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
      .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl == (LogDestination *)0x0)
  {
    pLVar4 = (LogDestination *)operator_new(0xd0);
    LogDestination(pLVar4,severity,(char *)0x0);
    local_30._M_head_impl = (LogDestination *)0x0;
    std::__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>::
    reset(this,pLVar4);
    std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::
    ~unique_ptr((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
                &local_30);
  }
  pLVar4 = (this->_M_t).
           super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
           .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl;
  __mutex = &(pLVar4->fileobject_).mutex_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    (pLVar4->fileobject_).base_filename_selected_ = true;
    psVar1 = &(pLVar4->fileobject_).base_filename_;
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar3 != 0) {
      __stream._M_head_impl =
           *(_IO_FILE **)
            &(pLVar4->fileobject_).file_._M_t.
             super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
             super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>;
      if ((_Head_base<0UL,__IO_FILE_*,_false>)__stream._M_head_impl !=
          (_Head_base<0UL,__IO_FILE_*,_false>)0x0) {
        (pLVar4->fileobject_).file_._M_t.
        super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
        super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_> =
             (_Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>)0x0;
        fclose((FILE *)__stream._M_head_impl);
        (pLVar4->fileobject_).rollover_attempt_ = 0x1f;
      }
      pcVar2 = (char *)(pLVar4->fileobject_).base_filename_._M_string_length;
      strlen(base_filename);
      std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)base_filename);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

inline void LogDestination::SetLogDestination(LogSeverity severity,
                                              const char* base_filename) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  std::lock_guard<std::mutex> l{log_mutex};
  log_destination(severity)->fileobject_.SetBasename(base_filename);
}